

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O2

void __thiscall
cmLinkItemGraphVisitor::VisitLinks
          (cmLinkItemGraphVisitor *this,cmLinkItem *item,cmLinkItem *rootItem,string *config)

{
  _Base_ptr *item_00;
  bool bVar1;
  string *__lhs;
  string *__rhs;
  _Base_ptr p_Var2;
  DependencyMap dependencies;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  GetDependencies(item->Target,config,(DependencyMap *)&local_60);
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    item_00 = &p_Var2[2]._M_parent;
    VisitItem(this,(cmLinkItem *)item_00);
    bVar1 = LinkVisited(this,item,(cmLinkItem *)item_00);
    if (!bVar1) {
      (*this->_vptr_cmLinkItemGraphVisitor[4])(this,item,item_00,(ulong)p_Var2[2]._M_color);
      __lhs = cmLinkItem::AsStr_abi_cxx11_(rootItem);
      __rhs = cmLinkItem::AsStr_abi_cxx11_(item);
      bVar1 = std::operator!=(__lhs,__rhs);
      if (bVar1) {
        (*this->_vptr_cmLinkItemGraphVisitor[5])(this,rootItem,item_00);
      }
      VisitLinks(this,(cmLinkItem *)item_00,(cmLinkItem *)item_00);
      VisitLinks(this,(cmLinkItem *)item_00,item);
      VisitLinks(this,(cmLinkItem *)item_00,rootItem);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLinkItemGraphVisitor::VisitLinks(cmLinkItem const& item,
                                        cmLinkItem const& rootItem,
                                        std::string const& config)
{
  auto const& target = *item.Target;

  DependencyMap dependencies;
  cmLinkItemGraphVisitor::GetDependencies(target, config, dependencies);

  for (auto const& d : dependencies) {
    auto const& dependency = d.second;
    auto const& dependencyType = dependency.first;
    auto const& dependee = dependency.second;
    this->VisitItem(dependee);

    if (this->LinkVisited(item, dependee)) {
      continue;
    }

    this->OnDirectLink(item, dependee, dependencyType);

    if (rootItem.AsStr() != item.AsStr()) {
      this->OnIndirectLink(rootItem, dependee);
    }

    // Visit all the direct and indirect links.
    this->VisitLinks(dependee, dependee);
    this->VisitLinks(dependee, item);
    this->VisitLinks(dependee, rootItem);
  }
}